

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::ConvertToOutputForExistingCommon
          (string *__return_storage_ptr__,cmOutputConverter *this,string *remote,string *result,
          OutputFormat format)

{
  pointer pcVar1;
  bool bVar2;
  cmState *this_00;
  long lVar3;
  string tmp;
  string local_50;
  
  this_00 = cmState::Snapshot::GetState(&this->StateSnapshot);
  bVar2 = cmState::UseWindowsShell(this_00);
  if (((bVar2) && (lVar3 = std::__cxx11::string::find((char)result,0x20), lVar3 != -1)) &&
     (bVar2 = cmsys::SystemTools::FileExists((remote->_M_dataplus)._M_p), bVar2)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar2 = cmsys::SystemTools::GetShortPath(remote,&local_50);
    if (bVar2) {
      ConvertToOutputFormat(__return_storage_ptr__,this,&local_50,format);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (result->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + result->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOutputConverter::ConvertToOutputForExistingCommon(const std::string& remote,
                                                    std::string const& result,
                                                    OutputFormat format) const
{
  // If this is a windows shell, the result has a space, and the path
  // already exists, we can use a short-path to reference it without a
  // space.
  if(this->GetState()->UseWindowsShell() && result.find(' ') != result.npos &&
     cmSystemTools::FileExists(remote.c_str()))
    {
    std::string tmp;
    if(cmSystemTools::GetShortPath(remote, tmp))
      {
      return this->ConvertToOutputFormat(tmp, format);
      }
    }

  // Otherwise, leave it unchanged.
  return result;
}